

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# probe.c
# Opt level: O0

atom * newMovingAtom(char *rec,void *userdata)

{
  int iVar1;
  residue *prVar2;
  movingAtomBuildInfo *m;
  atom *a;
  void *userdata_local;
  char *rec_local;
  
  if (rec == (char *)0x0) {
    rec_local = (char *)0x0;
  }
  else {
    if (*(long *)((long)userdata + 0x30) == 0) {
      prVar2 = newResidueData();
      *(residue **)((long)userdata + 0x30) = prVar2;
    }
    rec_local = (char *)newAtom(rec,*userdata,0,*(residue **)((long)userdata + 0x30));
    if ((atom *)rec_local != (atom *)0x0) {
      ((atom *)rec_local)->next = (atom_t *)0x0;
      if ((ImplicitH == 0) || (iVar1 = getAtno(((atom *)rec_local)->elem), iVar1 != 1)) {
        selectSource((atom *)rec_local,*(pattern **)((long)userdata + 0x18),1,
                     *(pattern **)((long)userdata + 0x20),2,(pattern *)0x0);
        if (**(long **)((long)userdata + 0x28) == 0) {
          **(undefined8 **)((long)userdata + 0x28) = *(undefined8 *)((long)userdata + 0x30);
          *(undefined8 *)((long)userdata + 0x30) = 0;
        }
        else {
          iVar1 = resDiffersFromPrev((residue *)**(undefined8 **)((long)userdata + 0x28),
                                     *(residue **)((long)userdata + 0x30));
          if (iVar1 == 0) {
            ((atom *)rec_local)->r = (residue_t *)**(undefined8 **)((long)userdata + 0x28);
            ((atom *)rec_local)->r->a = (atom *)rec_local;
          }
          else {
            **(undefined8 **)((long)userdata + 0x30) = **(undefined8 **)((long)userdata + 0x28);
            **(undefined8 **)((long)userdata + 0x28) = *(undefined8 *)((long)userdata + 0x30);
            *(undefined8 *)((long)userdata + 0x30) = 0;
          }
        }
      }
      else {
        deleteAtom((atom *)rec_local);
        rec_local = (char *)0x0;
      }
    }
  }
  return (atom *)rec_local;
}

Assistant:

atom * newMovingAtom(char *rec, void *userdata)
{
   atom* a = NULL;
   movingAtomBuildInfo *m = (movingAtomBuildInfo *)userdata;

   if (rec == NULL) { return NULL; }

   if (m->scratchRes == NULL) {
      m->scratchRes = newResidueData();
   }

   /*atom * newAtom(char *rec, int file, int model, residue * resDataBuf)*/
   a = newAtom(rec, m->filenum, 0, m->scratchRes);
   if (a) {
      a->next = NULL;
      if (ImplicitH && isHatom(a->elem)) {
	 deleteAtom(a);  /* filter out implicit hydrogens */
	 return NULL;
      }

      selectSource(a, m->srcPat, SET1, m->targPat, SET2, NULL);
             /* note: new moving atom can not be ignored using -IGNORE flag */

      if (*(m->reslstptr) == NULL) {/* first residue goes on residue list */
	 *(m->reslstptr) = m->scratchRes;
	 m->scratchRes = NULL;
      }
      else { /* otherwise we have to compare residue data blocks */
	 if (resDiffersFromPrev(*(m->reslstptr), m->scratchRes)) {
	    m->scratchRes->nextRes = *(m->reslstptr);
	    *(m->reslstptr) = m->scratchRes;
	    m->scratchRes = NULL;

	 }
	 else {
	    a->r = *(m->reslstptr); /* same, so point to prior block */
	    a->r->a = a; /* makes this atom the head of atom list for this res */
	 }
      }
   }
   return a;
}